

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O2

bool __thiscall ON_BrepRegionTopology::Read(ON_BrepRegionTopology *this,ON_BinaryArchive *file)

{
  uint uVar1;
  ON_BrepFaceSide *pOVar2;
  ON_BrepRegion *pOVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int major_version;
  int minor_version;
  int local_28 [2];
  
  local_28[0] = 0;
  local_28[1] = 0;
  bVar4 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,local_28,local_28 + 1);
  if (bVar4) {
    uVar7 = 0;
    if (local_28[0] == 1) {
      bVar4 = ON_BrepFaceSideArray::Read(&this->m_FS,file);
      uVar1 = (this->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.
              super_ON_ClassArray<ON_BrepFaceSide>.m_count;
      pOVar2 = (this->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.
               super_ON_ClassArray<ON_BrepFaceSide>.m_a;
      uVar6 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar6 = uVar7;
      }
      for (; uVar6 * 0x30 - uVar7 != 0; uVar7 = uVar7 + 0x30) {
        *(ON_BrepRegionTopology **)((long)&pOVar2->m_rtop + uVar7) = this;
      }
      uVar6 = 0;
      uVar7 = 0;
      if (bVar4) {
        bVar4 = ON_BrepRegionArray::Read(&this->m_R,file);
        uVar7 = (ulong)bVar4;
        uVar1 = (this->m_R).super_ON_ObjectArray<ON_BrepRegion>.super_ON_ClassArray<ON_BrepRegion>.
                m_count;
        pOVar3 = (this->m_R).super_ON_ObjectArray<ON_BrepRegion>.super_ON_ClassArray<ON_BrepRegion>.
                 m_a;
        uVar5 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar5 = uVar6;
        }
        for (; uVar5 * 0x78 - uVar6 != 0; uVar6 = uVar6 + 0x78) {
          *(ON_BrepRegionTopology **)((long)&pOVar3->m_rtop + uVar6) = this;
        }
      }
    }
    bVar4 = ON_BinaryArchive::EndRead3dmChunk(file);
    bVar4 = (bool)(bVar4 & (byte)uVar7);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ON_BrepRegionTopology::Read( ON_BinaryArchive& file )
{
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if ( !rc )
    return false;
  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    rc = m_FS.Read(file);
    for ( i = 0; i < m_FS.Count(); i++ )
      m_FS[i].m_rtop = this;
    if (!rc) break;

    rc = m_R.Read(file);
    for ( i = 0; i < m_R.Count(); i++ )
      m_R[i].m_rtop = this;
    if (!rc) break;

    break;
  }
  if ( !file.EndRead3dmChunk() )
    rc = false;
  return rc;
}